

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O0

bool ShaderParserParseTextures
               (string *base_path,string *prev_line,string *line,uint32_t current_char,
               uint32_t line_number,FErrorReport *report_error,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *watches,vector<Texture,_std::allocator<Texture>_> *textures)

{
  pointer *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  size_type sVar5;
  reference pvVar6;
  string local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string full_path;
  Texture texture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string uniform_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_64;
  undefined1 local_60 [4];
  int i;
  string path;
  int first_parenthesis_index;
  int last_parenthesis_index;
  FErrorReport *report_error_local;
  uint32_t line_number_local;
  uint32_t current_char_local;
  string *line_local;
  string *prev_line_local;
  string *base_path_local;
  
  path.field_2._12_4_ = 0xffffffff;
  path.field_2._8_4_ = 0xffffffff;
  std::__cxx11::string::substr((ulong)local_60,(ulong)prev_line);
  local_64 = 0;
  while( true ) {
    uVar2 = (ulong)local_64;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar2) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
    if (*pcVar4 == '(') {
      path.field_2._8_4_ = local_64;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
    if (*pcVar4 == ')') {
      path.field_2._12_4_ = local_64;
    }
    local_64 = local_64 + 1;
  }
  if ((int)path.field_2._8_4_ < (int)path.field_2._12_4_) {
    std::__cxx11::string::substr
              ((ulong)&uniform_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_60);
    this = &uniform_tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)local_60,(string *)this);
    std::__cxx11::string::~string((string *)this);
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&uniform_type.field_2 + 8),line,' ');
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&uniform_type.field_2 + 8));
    if (sVar5 == 3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&uniform_type.field_2 + 8),1);
      std::__cxx11::string::string((string *)local_f8,(string *)pvVar6);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f8,"sampler2D");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"@path syntax is only supported on sampler2D uniform types",
                   (allocator<char> *)&texture.field_0x3f);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
        ::operator()(report_error,&local_118,line_number);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&texture.field_0x3f);
        base_path_local._7_1_ = false;
      }
      else {
        stbi_set_flip_vertically_on_load(1);
        Texture::Texture((Texture *)((long)&full_path.field_2 + 8));
        std::operator+(&local_1a0,base_path,'/');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180,&local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
        std::__cxx11::string::~string((string *)&local_1a0);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        texture._8_8_ =
             stbi_load(pcVar4,(int *)(full_path.field_2._M_local_buf + 8),
                       (int *)(full_path.field_2._M_local_buf + 0xc),&texture.Width,4);
        base_path_local._7_1_ = (stbi_uc *)texture._8_8_ != (stbi_uc *)0x0;
        if (base_path_local._7_1_) {
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&uniform_type.field_2 + 8);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](this_00,2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](this_00,2);
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_1e0,(ulong)pvVar6);
          std::__cxx11::string::operator=((string *)&texture.Data,local_1e0);
          std::__cxx11::string::~string(local_1e0);
          std::vector<Texture,_std::allocator<Texture>_>::push_back
                    (textures,(value_type *)((long)&full_path.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(watches,(value_type *)local_180);
        }
        else {
          std::operator+(&local_1c0,"Failed to load texture at path ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
          ::operator()(report_error,&local_1c0,line_number);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
        std::__cxx11::string::~string((string *)local_180);
        Texture::~Texture((Texture *)((long)&full_path.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_f8);
    }
    else {
      base_path_local._7_1_ = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&uniform_type.field_2 + 8));
  }
  else {
    std::operator+(&local_98,"Path format should be @path(path): ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
    ::operator()(report_error,&local_98,line_number);
    std::__cxx11::string::~string((string *)&local_98);
    base_path_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_60);
  return base_path_local._7_1_;
}

Assistant:

bool ShaderParserParseTextures(const std::string& base_path, const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, std::vector<std::string>& watches, std::vector<Texture>& textures) {
    int last_parenthesis_index = -1;
    int first_parenthesis_index = -1;

    std::string path = prev_line.substr(current_char + 5, std::string::npos);

    for (int i = 0; i < path.size(); ++i) {
        if (path[i] == '(') first_parenthesis_index = i;
        if (path[i] == ')') last_parenthesis_index = i;
    }

    if (last_parenthesis_index <= first_parenthesis_index) {
        report_error("Path format should be @path(path): " + path, line_number);
        return false;
    }

    path = path.substr(first_parenthesis_index + 1, last_parenthesis_index - 1);

    std::vector<std::string> uniform_tokens = SplitString(line,  ' ');
    if (uniform_tokens.size() != 3) {
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type != "sampler2D") {
        report_error("@path syntax is only supported on sampler2D uniform types", line_number);
        return false;
    }

    stbi_set_flip_vertically_on_load(true);

    Texture texture;
    std::string full_path = base_path + PATH_DELIMITER + path;
    texture.Data = stbi_load(full_path.c_str(), &texture.Width, &texture.Height, &texture.Channels, 4);

    if (!texture.Data) {
        report_error("Failed to load texture at path " + path, line_number);
        return false;
    }
    texture.Binding = uniform_tokens[2].substr(0, uniform_tokens[2].length() - 1);

    textures.push_back(texture);
    watches.push_back(full_path);

    return true;
}